

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectwriter.cpp
# Opt level: O0

void __thiscall ProjectWriter::writeEnergy(ProjectWriter *this)

{
  Link *pLVar1;
  bool bVar2;
  int iVar3;
  _Setprecision _Var4;
  vector<Link_*,_std::allocator<Link_*>_> *this_00;
  reference ppLVar5;
  void *this_01;
  ostream *poVar6;
  Pump *pump;
  Link *link;
  iterator __end1;
  iterator __begin1;
  vector<Link_*,_std::allocator<Link_*>_> *__range1;
  undefined1 local_30 [40];
  ProjectWriter *this_local;
  
  local_30._32_8_ = this;
  std::operator<<((ostream *)&this->field_0x18,"\n[ENERGY]\n");
  Options::energyOptionsToStr_abi_cxx11_((Options *)local_30,(Network *)&this->network->options);
  std::operator<<((ostream *)&this->field_0x18,(string *)local_30);
  std::__cxx11::string::~string((string *)local_30);
  this_00 = &this->network->links;
  __end1 = std::vector<Link_*,_std::allocator<Link_*>_>::begin(this_00);
  link = (Link *)std::vector<Link_*,_std::allocator<Link_*>_>::end(this_00);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Link_**,_std::vector<Link_*,_std::allocator<Link_*>_>_>
                                     *)&link), bVar2) {
    ppLVar5 = __gnu_cxx::__normal_iterator<Link_**,_std::vector<Link_*,_std::allocator<Link_*>_>_>::
              operator*(&__end1);
    pLVar1 = *ppLVar5;
    iVar3 = (*(pLVar1->super_Element)._vptr_Element[2])();
    if (iVar3 == 1) {
      this_01 = (void *)std::ostream::operator<<(&this->field_0x18,std::left);
      poVar6 = (ostream *)std::ostream::operator<<(this_01,std::fixed);
      _Var4 = std::setprecision(4);
      std::operator<<(poVar6,_Var4);
      if (pLVar1[2].super_Element._vptr_Element != (_func_int **)0x0) {
        poVar6 = std::operator<<((ostream *)&this->field_0x18,"PUMP  ");
        poVar6 = std::operator<<(poVar6,(string *)&(pLVar1->super_Element).name);
        poVar6 = std::operator<<(poVar6,"  ");
        std::operator<<(poVar6,"EFFIC  ");
        poVar6 = std::operator<<((ostream *)&this->field_0x18,
                                 (string *)(pLVar1[2].super_Element._vptr_Element + 1));
        std::operator<<(poVar6,"\n");
      }
      if (0.0 < *(double *)&pLVar1[2].super_Element.field_0x10) {
        poVar6 = std::operator<<((ostream *)&this->field_0x18,"PUMP  ");
        poVar6 = std::operator<<(poVar6,(string *)&(pLVar1->super_Element).name);
        poVar6 = std::operator<<(poVar6,"  ");
        poVar6 = std::operator<<(poVar6,"PRICE  ");
        poVar6 = (ostream *)
                 std::ostream::operator<<(poVar6,*(double *)&pLVar1[2].super_Element.field_0x10);
        std::operator<<(poVar6,"\n");
      }
      if (*(long *)&pLVar1[2].super_Element.name != 0) {
        poVar6 = std::operator<<((ostream *)&this->field_0x18,"PUMP  ");
        poVar6 = std::operator<<(poVar6,(string *)&(pLVar1->super_Element).name);
        poVar6 = std::operator<<(poVar6,"  ");
        std::operator<<(poVar6,"PATTERN  ");
        poVar6 = std::operator<<((ostream *)&this->field_0x18,
                                 (string *)(*(long *)&pLVar1[2].super_Element.name + 8));
        std::operator<<(poVar6,"\n");
      }
    }
    __gnu_cxx::__normal_iterator<Link_**,_std::vector<Link_*,_std::allocator<Link_*>_>_>::operator++
              (&__end1);
  }
  return;
}

Assistant:

void ProjectWriter::writeEnergy()
{
    fout << "\n[ENERGY]\n";
    fout << network->options.energyOptionsToStr(network);
    for (Link* link : network->links)
    {
    	if ( link->type() == Link::PUMP )
    	{
    	    Pump* pump = static_cast<Pump*>(link);
    	    fout << left << fixed << setprecision(4);
    	    if ( pump->efficCurve )
    	    {
    	        fout << "PUMP  " << link->name << "  " << "EFFIC  ";
    	        fout << pump->efficCurve->name << "\n";
    	    }

    	    if ( pump->costPerKwh > 0.0 )
    	    {
    	        fout << "PUMP  " << link->name << "  " << "PRICE  " << pump->costPerKwh << "\n";
    	    }

    	    if ( pump->costPattern )
    	    {
    	        fout << "PUMP  " << link->name << "  " << "PATTERN  ";
    	        fout << pump->costPattern->name << "\n";
    	    }
    	}
    }
}